

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_bindings.cpp
# Opt level: O0

void __thiscall PyServerSession::send_packet_data(PyServerSession *this,char *data,size_t size)

{
  bool bVar1;
  bytes local_58;
  object local_50;
  object o;
  handle local_38;
  function overload;
  gil_scoped_acquire gil;
  size_t size_local;
  char *data_local;
  PyServerSession *this_local;
  
  pybind11::gil_scoped_acquire::gil_scoped_acquire((gil_scoped_acquire *)&overload);
  pybind11::get_overload<ki::protocol::net::ServerSession>
            ((pybind11 *)&local_38,&this->super_ServerSession,"send_packet_data");
  bVar1 = pybind11::handle::operator_cast_to_bool(&local_38);
  if (bVar1) {
    pybind11::bytes::bytes(&local_58,data,size);
    pybind11::detail::object_api<pybind11::handle>::operator()
              ((object_api<pybind11::handle> *)&local_50,(bytes *)&local_38,
               (unsigned_long *)&local_58);
    pybind11::bytes::~bytes(&local_58);
    pybind11::detail::cast_safe<void>(&local_50);
    pybind11::object::~object(&local_50);
  }
  pybind11::function::~function((function *)&local_38);
  pybind11::gil_scoped_acquire::~gil_scoped_acquire((gil_scoped_acquire *)&overload);
  if (!bVar1) {
    pybind11::pybind11_fail
              (
              "Tried to call pure virtual function \"ki::protocol::net::ServerSession::send_packet_data\""
              );
  }
  return;
}

Assistant:

void send_packet_data(const char *data, const size_t size) override
    {
        PYBIND11_OVERLOAD_PURE(
            void, ki::protocol::net::ServerSession,
            send_packet_data, py::bytes(data, size), size);
    }